

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O3

void __thiscall Omega_h::ExprEnv::ExprEnv(ExprEnv *this,LO size_in,Int dim_in)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  size_type *psVar4;
  long lVar5;
  long lVar6;
  string *psVar7;
  long lVar8;
  undefined8 *puVar9;
  offset_in__Undefined_class_to_subr oVar10;
  byte bVar11;
  undefined1 auVar12 [16];
  bool bVar14;
  undefined8 uVar15;
  Matrix<3,_3> a;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  string local_88 [2];
  storage_union local_40;
  undefined1 *local_30;
  long lVar13;
  
  bVar11 = 0;
  p_Var1 = &(this->variables)._M_t._M_impl.super__Rb_tree_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->functions)._M_t._M_impl.super__Rb_tree_header;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->functions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->size = size_in;
  this->dim = dim_in;
  paVar2 = &local_88[0].field_2;
  local_88[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"exp","");
  local_a8._8_8_ = 0;
  local_a8._4_4_ = 0;
  local_a8._0_4_ = size_in;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:668:14)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:668:14)>
             ::_M_manager;
  register_function(this,local_88,(Function *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
  }
  local_88[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"sqrt","");
  local_a8._8_8_ = 0;
  local_a8._4_4_ = 0;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:670:15)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:670:15)>
             ::_M_manager;
  register_function(this,local_88,(Function *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
  }
  local_88[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"sin","");
  local_a8._8_8_ = 0;
  local_a8._4_4_ = 0;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:672:14)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:672:14)>
             ::_M_manager;
  register_function(this,local_88,(Function *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
  }
  local_88[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"cos","");
  local_a8._8_8_ = 0;
  local_a8._4_4_ = 0;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:674:14)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:674:14)>
             ::_M_manager;
  register_function(this,local_88,(Function *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
  }
  local_88[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"erf","");
  local_a8._8_8_ = 0;
  local_a8._4_4_ = 0;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:676:14)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:676:14)>
             ::_M_manager;
  register_function(this,local_88,(Function *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
  }
  local_88[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"vector","");
  local_a8._8_8_ = 0;
  oVar10 = CONCAT44(dim_in,size_in);
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:678:7)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:678:7)>
             ::_M_manager;
  local_a8._M_unused._M_member_pointer = oVar10;
  register_function(this,local_88,(Function *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
  }
  local_88[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"symm","");
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:680:7)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:680:7)>
             ::_M_manager;
  local_a8._M_unused._M_member_pointer = oVar10;
  register_function(this,local_88,(Function *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
  }
  local_88[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"matrix","");
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:682:7)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:682:7)>
             ::_M_manager;
  local_a8._M_unused._M_member_pointer = oVar10;
  register_function(this,local_88,(Function *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
  }
  local_88[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"tensor","");
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:684:7)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:684:7)>
             ::_M_manager;
  local_a8._M_unused._M_member_pointer = oVar10;
  register_function(this,local_88,(Function *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
  }
  local_88[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"norm","");
  local_a8._8_8_ = 0;
  local_a8._M_unused._M_member_pointer = CONCAT44(size_in,dim_in);
  local_90 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:686:7)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp:686:7)>
             ::_M_manager;
  register_function(this,local_88,(Function *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
  }
  local_88[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"d","");
  local_a8._M_unused._0_8_ = (undefined8)(double)this->dim;
  local_98 = (code *)any::vtable_for_type<double>()::table;
  register_variable(this,local_88,(any *)&local_a8);
  if (local_98 != (code *)0x0) {
    (**(code **)(local_98 + 8))((storage_union *)&local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
  }
  iVar3 = this->dim;
  if (iVar3 == 3) {
    local_a8._M_unused._M_object = &local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"I","");
    psVar4 = &local_88[0]._M_string_length;
    lVar5 = 0;
    lVar6 = 0;
    do {
      lVar8 = 0;
      auVar12 = _DAT_00443a30;
      do {
        bVar14 = SUB164(auVar12 ^ _DAT_00443a40,4) == -0x80000000 &&
                 SUB164(auVar12 ^ _DAT_00443a40,0) < -0x7ffffffd;
        if (bVar14) {
          uVar15 = 0x3ff0000000000000;
          if (lVar5 != lVar8) {
            uVar15 = 0;
          }
          *(undefined8 *)((long)psVar4 + lVar8 + -8) = uVar15;
        }
        if (bVar14) {
          uVar15 = 0x3ff0000000000000;
          if (lVar5 + -8 != lVar8) {
            uVar15 = 0;
          }
          *(undefined8 *)((long)psVar4 + lVar8) = uVar15;
        }
        lVar13 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 2;
        auVar12._8_8_ = lVar13 + 2;
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x20);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 8;
      psVar4 = psVar4 + 3;
    } while (lVar6 != 3);
    local_30 = any::vtable_for_type<Omega_h::Matrix<3,3>>()::table;
    local_40.dynamic = operator_new(0x48);
    psVar7 = local_88;
    puVar9 = (undefined8 *)local_40.dynamic;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar9 = (psVar7->_M_dataplus)._M_p;
      psVar7 = (string *)((long)psVar7 + ((ulong)bVar11 * -2 + 1) * 8);
      puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
    }
    register_variable(this,(string *)&local_a8,(any *)&local_40);
    if (local_30 != (undefined1 *)0x0) {
      (**(code **)(local_30 + 8))(&local_40);
    }
    if ((code **)local_a8._M_unused._0_8_ != &local_98) {
      operator_delete(local_a8._M_unused._M_object,(ulong)(local_98 + 1));
    }
    iVar3 = this->dim;
  }
  if (iVar3 == 2) {
    local_88[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"I","");
    local_98 = (code *)any::vtable_for_type<Omega_h::Matrix<2,2>>()::table;
    local_a8._M_unused._M_object = operator_new(0x20);
    *(code **)local_a8._M_unused._0_8_ = (code *)0x3ff0000000000000;
    *(code **)((long)local_a8._M_unused._0_8_ + 8) = (code *)0x0;
    *(code **)((long)local_a8._M_unused._0_8_ + 0x10) = (code *)0x0;
    *(code **)((long)local_a8._M_unused._0_8_ + 0x18) = (code *)0x3ff0000000000000;
    register_variable(this,local_88,(any *)&local_a8);
    if (local_98 != (code *)0x0) {
      (**(code **)(local_98 + 8))((storage_union *)&local_a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
    }
    iVar3 = this->dim;
  }
  if (iVar3 == 1) {
    local_88[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"I","");
    local_98 = (code *)any::vtable_for_type<Omega_h::Matrix<1,1>>()::table;
    local_a8._M_unused._M_member_pointer = 0x3ff0000000000000;
    register_variable(this,local_88,(any *)&local_a8);
    if (local_98 != (code *)0x0) {
      (**(code **)(local_98 + 8))((storage_union *)&local_a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
    }
  }
  local_88[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"pi","");
  local_98 = (code *)any::vtable_for_type<double>()::table;
  local_a8._M_unused._M_object = (void *)0x400921fb54442d18;
  register_variable(this,local_88,(any *)&local_a8);
  if (local_98 != (code *)0x0) {
    (**(code **)(local_98 + 8))((storage_union *)&local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ExprEnv::ExprEnv(LO size_in, Int dim_in) : size(size_in), dim(dim_in) {
  auto local_size = size;
  auto local_dim = dim;
  register_function(
      "exp", [=](Args& args) { return eval_exp(local_size, args); });
  register_function(
      "sqrt", [=](Args& args) { return eval_sqrt(local_size, args); });
  register_function(
      "sin", [=](Args& args) { return eval_sin(local_size, args); });
  register_function(
      "cos", [=](Args& args) { return eval_cos(local_size, args); });
  register_function(
      "erf", [=](Args& args) { return eval_erf(local_size, args); });
  register_function("vector",
      [=](Args& args) { return make_vector(local_size, local_dim, args); });
  register_function("symm",
      [=](Args& args) { return make_symm(local_size, local_dim, args); });
  register_function("matrix",
      [=](Args& args) { return make_matrix(local_size, local_dim, args); });
  register_function("tensor",
      [=](Args& args) { return make_matrix(local_size, local_dim, args); });
  register_function("norm",
      [=](Args& args) { return eval_norm(local_dim, local_size, args); });
  register_variable("d", any(Real(dim)));
  if (dim == 3) register_variable("I", any(identity_matrix<3, 3>()));
  if (dim == 2) register_variable("I", any(identity_matrix<2, 2>()));
  if (dim == 1) register_variable("I", any(identity_matrix<1, 1>()));
  register_variable("pi", any(Real(Omega_h::PI)));
}